

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::encode_bc4(void *pDst,uint8_t *pPixels,uint32_t stride)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint *puVar26;
  ulong uVar27;
  uint in_EDX;
  byte *in_RSI;
  undefined1 *in_RDI;
  uint64_t f;
  int v3_6;
  int v2_6;
  int v1_6;
  int v0_6;
  int v3_5;
  int v2_5;
  int v1_5;
  int v0_5;
  int v3_4;
  int v2_4;
  int v1_4;
  int v0_4;
  int v3_3;
  int v2_3;
  int v1_3;
  int v0_3;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  int bias;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  uint32_t delta;
  uint8_t *pDst_bytes;
  uint32_t max_v;
  uint32_t min_v;
  uint32_t v3_2;
  uint32_t v2_2;
  uint32_t v1_2;
  uint32_t v0_2;
  uint32_t v3_1;
  uint32_t v2_1;
  uint32_t v1_1;
  uint32_t v0_1;
  uint32_t v3;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  uint32_t max3_v;
  uint32_t min3_v;
  uint32_t max2_v;
  uint32_t min2_v;
  uint32_t max1_v;
  uint32_t min1_v;
  uint32_t max0_v;
  uint32_t min0_v;
  undefined8 in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  byte *local_10;
  undefined1 *local_8;
  
  local_1c = (uint)*in_RSI;
  local_24 = (uint)in_RSI[in_EDX];
  local_2c = (uint)in_RSI[in_EDX << 1];
  local_34 = (uint)in_RSI[in_EDX * 3];
  local_38 = (uint)in_RSI[in_EDX << 2];
  local_30 = local_34;
  local_28 = local_2c;
  local_20 = local_24;
  local_18 = local_1c;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  puVar26 = std::min<unsigned_int>(&local_18,&local_38);
  local_18 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_1c,&local_38);
  local_1c = *puVar26;
  local_3c = (uint)local_10[local_14 * 5];
  puVar26 = std::min<unsigned_int>(&local_20,&local_3c);
  local_20 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_24,&local_3c);
  local_24 = *puVar26;
  local_40 = (uint)local_10[local_14 * 6];
  puVar26 = std::min<unsigned_int>(&local_28,&local_40);
  local_28 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_2c,&local_40);
  local_2c = *puVar26;
  local_44 = (uint)local_10[local_14 * 7];
  puVar26 = std::min<unsigned_int>(&local_30,&local_44);
  local_30 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_34,&local_44);
  local_34 = *puVar26;
  local_48 = (uint)local_10[local_14 << 3];
  puVar26 = std::min<unsigned_int>(&local_18,&local_48);
  local_18 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_1c,&local_48);
  local_1c = *puVar26;
  local_4c = (uint)local_10[local_14 * 9];
  puVar26 = std::min<unsigned_int>(&local_20,&local_4c);
  local_20 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_24,&local_4c);
  local_24 = *puVar26;
  local_50 = (uint)local_10[local_14 * 10];
  puVar26 = std::min<unsigned_int>(&local_28,&local_50);
  local_28 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_2c,&local_50);
  local_2c = *puVar26;
  local_54 = (uint)local_10[local_14 * 0xb];
  puVar26 = std::min<unsigned_int>(&local_30,&local_54);
  local_30 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_34,&local_54);
  local_34 = *puVar26;
  local_58 = (uint)local_10[local_14 * 0xc];
  puVar26 = std::min<unsigned_int>(&local_18,&local_58);
  local_18 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_1c,&local_58);
  local_1c = *puVar26;
  local_5c = (uint)local_10[local_14 * 0xd];
  puVar26 = std::min<unsigned_int>(&local_20,&local_5c);
  local_20 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_24,&local_5c);
  local_24 = *puVar26;
  local_60 = (uint)local_10[local_14 * 0xe];
  puVar26 = std::min<unsigned_int>(&local_28,&local_60);
  local_28 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_2c,&local_60);
  local_2c = *puVar26;
  local_64 = (uint)local_10[local_14 * 0xf];
  puVar26 = std::min<unsigned_int>(&local_30,&local_64);
  local_30 = *puVar26;
  puVar26 = std::max<unsigned_int>(&local_34,&local_64);
  local_34 = *puVar26;
  uVar1 = minimum<unsigned_int>
                    (in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                     (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (uint)in_stack_fffffffffffffef8);
  uVar2 = maximum<unsigned_int>
                    (in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                     (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (uint)in_stack_fffffffffffffef8);
  *local_8 = (char)uVar2;
  local_8[1] = (char)uVar1;
  if (uVar2 == uVar1) {
    memset(local_8 + 2,0,6);
  }
  else {
    iVar3 = uVar2 - uVar1;
    iVar4 = iVar3 * 0xd;
    iVar5 = iVar3 * 0xb;
    iVar6 = iVar3 * 9;
    iVar7 = iVar3 * 7;
    iVar8 = iVar3 * 5;
    iVar9 = iVar3 * 3;
    iVar10 = uVar1 * -0xe + 4;
    iVar11 = (uint)*local_10 * 0xe + iVar10;
    iVar12 = (uint)local_10[local_14] * 0xe + iVar10;
    iVar13 = (uint)local_10[local_14 << 1] * 0xe + iVar10;
    iVar14 = (uint)local_10[local_14 * 3] * 0xe + iVar10;
    iVar15 = (uint)local_10[local_14 << 2] * 0xe + iVar10;
    iVar16 = (uint)local_10[local_14 * 5] * 0xe + iVar10;
    iVar17 = (uint)local_10[local_14 * 6] * 0xe + iVar10;
    iVar18 = (uint)local_10[local_14 * 7] * 0xe + iVar10;
    iVar19 = (uint)local_10[local_14 << 3] * 0xe + iVar10;
    iVar20 = (uint)local_10[local_14 * 9] * 0xe + iVar10;
    iVar21 = (uint)local_10[local_14 * 10] * 0xe + iVar10;
    iVar22 = (uint)local_10[local_14 * 0xb] * 0xe + iVar10;
    iVar23 = (uint)local_10[local_14 * 0xc] * 0xe + iVar10;
    iVar24 = (uint)local_10[local_14 * 0xd] * 0xe + iVar10;
    iVar25 = (uint)local_10[local_14 * 0xe] * 0xe + iVar10;
    iVar10 = (uint)local_10[local_14 * 0xf] * 0xe + iVar10;
    uVar27 = (ulong)encode_bc4::s_tran0
                    [(int)((uint)(iVar4 <= iVar23) + (uint)(iVar5 <= iVar23) +
                           (uint)(iVar6 <= iVar23) + (uint)(iVar7 <= iVar23) +
                           (uint)(iVar8 <= iVar23) + (uint)(iVar9 <= iVar23) +
                          (uint)(iVar3 <= iVar23))] << 0x24 |
             (ulong)encode_bc4::s_tran0
                    [(int)((uint)(iVar4 <= iVar19) + (uint)(iVar5 <= iVar19) +
                           (uint)(iVar6 <= iVar19) + (uint)(iVar7 <= iVar19) +
                           (uint)(iVar8 <= iVar19) + (uint)(iVar9 <= iVar19) +
                          (uint)(iVar3 <= iVar19))] << 0x18 |
             (ulong)(encode_bc4::s_tran0
                     [(int)((uint)(iVar4 <= iVar15) + (uint)(iVar5 <= iVar15) +
                            (uint)(iVar6 <= iVar15) + (uint)(iVar7 <= iVar15) +
                            (uint)(iVar8 <= iVar15) + (uint)(iVar9 <= iVar15) +
                           (uint)(iVar3 <= iVar15))] << 0xc |
                    encode_bc4::s_tran0
                    [(int)((uint)(iVar4 <= iVar11) + (uint)(iVar5 <= iVar11) +
                           (uint)(iVar6 <= iVar11) + (uint)(iVar7 <= iVar11) +
                           (uint)(iVar8 <= iVar11) + (uint)(iVar9 <= iVar11) +
                          (uint)(iVar3 <= iVar11))]) |
             (ulong)encode_bc4::s_tran1
                    [(int)((uint)(iVar4 <= iVar24) + (uint)(iVar5 <= iVar24) +
                           (uint)(iVar6 <= iVar24) + (uint)(iVar7 <= iVar24) +
                           (uint)(iVar8 <= iVar24) + (uint)(iVar9 <= iVar24) +
                          (uint)(iVar3 <= iVar24))] << 0x24 |
             (ulong)encode_bc4::s_tran1
                    [(int)((uint)(iVar4 <= iVar20) + (uint)(iVar5 <= iVar20) +
                           (uint)(iVar6 <= iVar20) + (uint)(iVar7 <= iVar20) +
                           (uint)(iVar8 <= iVar20) + (uint)(iVar9 <= iVar20) +
                          (uint)(iVar3 <= iVar20))] << 0x18 |
             (ulong)(encode_bc4::s_tran1
                     [(int)((uint)(iVar4 <= iVar16) + (uint)(iVar5 <= iVar16) +
                            (uint)(iVar6 <= iVar16) + (uint)(iVar7 <= iVar16) +
                            (uint)(iVar8 <= iVar16) + (uint)(iVar9 <= iVar16) +
                           (uint)(iVar3 <= iVar16))] << 0xc |
                    encode_bc4::s_tran1
                    [(int)((uint)(iVar4 <= iVar12) + (uint)(iVar5 <= iVar12) +
                           (uint)(iVar6 <= iVar12) + (uint)(iVar7 <= iVar12) +
                           (uint)(iVar8 <= iVar12) + (uint)(iVar9 <= iVar12) +
                          (uint)(iVar3 <= iVar12))]) |
             (ulong)encode_bc4::s_tran2
                    [(int)((uint)(iVar4 <= iVar25) + (uint)(iVar5 <= iVar25) +
                           (uint)(iVar6 <= iVar25) + (uint)(iVar7 <= iVar25) +
                           (uint)(iVar8 <= iVar25) + (uint)(iVar9 <= iVar25) +
                          (uint)(iVar3 <= iVar25))] << 0x24 |
             (ulong)encode_bc4::s_tran2
                    [(int)((uint)(iVar4 <= iVar21) + (uint)(iVar5 <= iVar21) +
                           (uint)(iVar6 <= iVar21) + (uint)(iVar7 <= iVar21) +
                           (uint)(iVar8 <= iVar21) + (uint)(iVar9 <= iVar21) +
                          (uint)(iVar3 <= iVar21))] << 0x18 |
             (ulong)(encode_bc4::s_tran2
                     [(int)((uint)(iVar4 <= iVar17) + (uint)(iVar5 <= iVar17) +
                            (uint)(iVar6 <= iVar17) + (uint)(iVar7 <= iVar17) +
                            (uint)(iVar8 <= iVar17) + (uint)(iVar9 <= iVar17) +
                           (uint)(iVar3 <= iVar17))] << 0xc |
                    encode_bc4::s_tran2
                    [(int)((uint)(iVar4 <= iVar13) + (uint)(iVar5 <= iVar13) +
                           (uint)(iVar6 <= iVar13) + (uint)(iVar7 <= iVar13) +
                           (uint)(iVar8 <= iVar13) + (uint)(iVar9 <= iVar13) +
                          (uint)(iVar3 <= iVar13))]) |
             (ulong)encode_bc4::s_tran3
                    [(int)((uint)(iVar4 <= iVar10) + (uint)(iVar5 <= iVar10) +
                           (uint)(iVar6 <= iVar10) + (uint)(iVar7 <= iVar10) +
                           (uint)(iVar8 <= iVar10) + (uint)(iVar9 <= iVar10) +
                          (uint)(iVar3 <= iVar10))] << 0x24 |
             (ulong)encode_bc4::s_tran3
                    [(int)((uint)(iVar4 <= iVar22) + (uint)(iVar5 <= iVar22) +
                           (uint)(iVar6 <= iVar22) + (uint)(iVar7 <= iVar22) +
                           (uint)(iVar8 <= iVar22) + (uint)(iVar9 <= iVar22) +
                          (uint)(iVar3 <= iVar22))] << 0x18 |
             (ulong)(encode_bc4::s_tran3
                     [(int)((uint)(iVar4 <= iVar18) + (uint)(iVar5 <= iVar18) +
                            (uint)(iVar6 <= iVar18) + (uint)(iVar7 <= iVar18) +
                            (uint)(iVar8 <= iVar18) + (uint)(iVar9 <= iVar18) +
                           (uint)(iVar3 <= iVar18))] << 0xc |
                    encode_bc4::s_tran3
                    [(int)((uint)(iVar4 <= iVar14) + (uint)(iVar5 <= iVar14) +
                           (uint)(iVar6 <= iVar14) + (uint)(iVar7 <= iVar14) +
                           (uint)(iVar8 <= iVar14) + (uint)(iVar9 <= iVar14) +
                          (uint)(iVar3 <= iVar14))]);
    local_8[2] = (char)uVar27;
    local_8[3] = (char)(uVar27 >> 8);
    local_8[4] = (char)(uVar27 >> 0x10);
    local_8[5] = (char)(uVar27 >> 0x18);
    local_8[6] = (char)(uVar27 >> 0x20);
    local_8[7] = (char)(uVar27 >> 0x28);
  }
  return;
}

Assistant:

void encode_bc4(void* pDst, const uint8_t* pPixels, uint32_t stride)
	{
		assert(g_initialized);

		uint32_t min0_v, max0_v, min1_v, max1_v, min2_v, max2_v, min3_v, max3_v;

		{
			min0_v = max0_v = pPixels[0 * stride];
			min1_v = max1_v = pPixels[1 * stride];
			min2_v = max2_v = pPixels[2 * stride];
			min3_v = max3_v = pPixels[3 * stride];
		}

		{
			uint32_t v0 = pPixels[4 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[5 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[6 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[7 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		{
			uint32_t v0 = pPixels[8 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[9 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[10 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[11 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		{
			uint32_t v0 = pPixels[12 * stride]; min0_v = std::min(min0_v, v0); max0_v = std::max(max0_v, v0);
			uint32_t v1 = pPixels[13 * stride]; min1_v = std::min(min1_v, v1); max1_v = std::max(max1_v, v1);
			uint32_t v2 = pPixels[14 * stride]; min2_v = std::min(min2_v, v2); max2_v = std::max(max2_v, v2);
			uint32_t v3 = pPixels[15 * stride]; min3_v = std::min(min3_v, v3); max3_v = std::max(max3_v, v3);
		}

		const uint32_t min_v = minimum(min0_v, min1_v, min2_v, min3_v);
		const uint32_t max_v = maximum(max0_v, max1_v, max2_v, max3_v);

		uint8_t* pDst_bytes = static_cast<uint8_t*>(pDst);
		pDst_bytes[0] = (uint8_t)max_v;
		pDst_bytes[1] = (uint8_t)min_v;

		if (max_v == min_v)
		{
			memset(pDst_bytes + 2, 0, 6);
			return;
		}

		const uint32_t delta = max_v - min_v;

		// min_v is now 0. Compute thresholds between values by scaling max_v. It's x14 because we're adding two x7 scale factors.
		const int t0 = delta * 13;
		const int t1 = delta * 11;
		const int t2 = delta * 9;
		const int t3 = delta * 7;
		const int t4 = delta * 5;
		const int t5 = delta * 3;
		const int t6 = delta * 1;

		// BC4 floors in its divisions, which we compensate for with the 4 bias.
		// This function is optimal for all possible inputs (i.e. it outputs the same results as checking all 8 values and choosing the closest one).
		const int bias = 4 - min_v * 14;

		static const uint32_t s_tran0[8] = { 1U      , 7U      , 6U      , 5U      , 4U      , 3U      , 2U      , 0U };
		static const uint32_t s_tran1[8] = { 1U << 3U, 7U << 3U, 6U << 3U, 5U << 3U, 4U << 3U, 3U << 3U, 2U << 3U, 0U << 3U };
		static const uint32_t s_tran2[8] = { 1U << 6U, 7U << 6U, 6U << 6U, 5U << 6U, 4U << 6U, 3U << 6U, 2U << 6U, 0U << 6U };
		static const uint32_t s_tran3[8] = { 1U << 9U, 7U << 9U, 6U << 9U, 5U << 9U, 4U << 9U, 3U << 9U, 2U << 9U, 0U << 9U };

		uint64_t a0, a1, a2, a3;
		{
			const int v0 = pPixels[0 * stride] * 14 + bias;
			const int v1 = pPixels[1 * stride] * 14 + bias;
			const int v2 = pPixels[2 * stride] * 14 + bias;
			const int v3 = pPixels[3 * stride] * 14 + bias;
			a0 = s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)];
			a1 = s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)];
			a2 = s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)];
			a3 = s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)];
		}

		{
			const int v0 = pPixels[4 * stride] * 14 + bias;
			const int v1 = pPixels[5 * stride] * 14 + bias;
			const int v2 = pPixels[6 * stride] * 14 + bias;
			const int v3 = pPixels[7 * stride] * 14 + bias;
			a0 |= (uint64_t)(s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)] << 12U);
			a1 |= (uint64_t)(s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)] << 12U);
			a2 |= (uint64_t)(s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)] << 12U);
			a3 |= (uint64_t)(s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)] << 12U);
		}

		{
			const int v0 = pPixels[8 * stride] * 14 + bias;
			const int v1 = pPixels[9 * stride] * 14 + bias;
			const int v2 = pPixels[10 * stride] * 14 + bias;
			const int v3 = pPixels[11 * stride] * 14 + bias;
			a0 |= (((uint64_t)s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)]) << 24U);
			a1 |= (((uint64_t)s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)]) << 24U);
			a2 |= (((uint64_t)s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)]) << 24U);
			a3 |= (((uint64_t)s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)]) << 24U);
		}

		{
			const int v0 = pPixels[12 * stride] * 14 + bias;
			const int v1 = pPixels[13 * stride] * 14 + bias;
			const int v2 = pPixels[14 * stride] * 14 + bias;
			const int v3 = pPixels[15 * stride] * 14 + bias;
			a0 |= (((uint64_t)s_tran0[(v0 >= t0) + (v0 >= t1) + (v0 >= t2) + (v0 >= t3) + (v0 >= t4) + (v0 >= t5) + (v0 >= t6)]) << 36U);
			a1 |= (((uint64_t)s_tran1[(v1 >= t0) + (v1 >= t1) + (v1 >= t2) + (v1 >= t3) + (v1 >= t4) + (v1 >= t5) + (v1 >= t6)]) << 36U);
			a2 |= (((uint64_t)s_tran2[(v2 >= t0) + (v2 >= t1) + (v2 >= t2) + (v2 >= t3) + (v2 >= t4) + (v2 >= t5) + (v2 >= t6)]) << 36U);
			a3 |= (((uint64_t)s_tran3[(v3 >= t0) + (v3 >= t1) + (v3 >= t2) + (v3 >= t3) + (v3 >= t4) + (v3 >= t5) + (v3 >= t6)]) << 36U);
		}

		const uint64_t f = a0 | a1 | a2 | a3;

		pDst_bytes[2] = (uint8_t)f;
		pDst_bytes[3] = (uint8_t)(f >> 8U);
		pDst_bytes[4] = (uint8_t)(f >> 16U);
		pDst_bytes[5] = (uint8_t)(f >> 24U);
		pDst_bytes[6] = (uint8_t)(f >> 32U);
		pDst_bytes[7] = (uint8_t)(f >> 40U);
	}